

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O3

void IDAQuadSensFree(void *ida_mem)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  
  if (ida_mem != (void *)0x0) {
    if (*(int *)((long)ida_mem + 0x6c0) != 0) {
      iVar3 = 4;
      if (4 < *(int *)((long)ida_mem + 0x560)) {
        iVar3 = *(int *)((long)ida_mem + 0x560);
      }
      N_VDestroyVectorArray
                (*(undefined8 *)((long)ida_mem + 0x440),*(undefined4 *)((long)ida_mem + 0xa0));
      N_VDestroyVectorArray
                (*(undefined8 *)((long)ida_mem + 0x430),*(undefined4 *)((long)ida_mem + 0xa0));
      N_VDestroyVectorArray
                (*(undefined8 *)((long)ida_mem + 0x438),*(undefined4 *)((long)ida_mem + 0xa0));
      N_VDestroyVectorArray
                (*(undefined8 *)((long)ida_mem + 0x448),*(undefined4 *)((long)ida_mem + 0xa0));
      N_VDestroy(*(undefined8 *)((long)ida_mem + 0x450));
      uVar2 = 0;
      do {
        N_VDestroyVectorArray
                  (*(undefined8 *)((long)ida_mem + uVar2 * 8 + 0x400),
                   *(undefined4 *)((long)ida_mem + 0xa0));
        uVar2 = uVar2 + 1;
      } while (iVar3 + 1 != uVar2);
      lVar1 = (long)((iVar3 + 5) * *(int *)((long)ida_mem + 0xa0));
      *(long *)((long)ida_mem + 0x678) =
           *(long *)((long)ida_mem + 0x678) - *(long *)((long)ida_mem + 0x668) * lVar1;
      *(long *)((long)ida_mem + 0x680) =
           *(long *)((long)ida_mem + 0x680) - lVar1 * *(long *)((long)ida_mem + 0x670);
      if (*(int *)((long)ida_mem + 0x6b8) != 0) {
        N_VDestroyVectorArray(*(undefined8 *)((long)ida_mem + 0x148));
        *(long *)((long)ida_mem + 0x678) =
             *(long *)((long)ida_mem + 0x678) -
             *(long *)((long)ida_mem + 0x668) * (long)*(int *)((long)ida_mem + 0xa0);
        *(long *)((long)ida_mem + 0x680) =
             *(long *)((long)ida_mem + 0x680) -
             (long)*(int *)((long)ida_mem + 0xa0) * *(long *)((long)ida_mem + 0x670);
      }
      if (*(int *)((long)ida_mem + 0x6bc) != 0) {
        free(*(void **)((long)ida_mem + 0x140));
        *(undefined8 *)((long)ida_mem + 0x140) = 0;
        *(long *)((long)ida_mem + 0x678) =
             *(long *)((long)ida_mem + 0x678) - (long)*(int *)((long)ida_mem + 0xa0);
      }
      *(undefined8 *)((long)ida_mem + 0x6b8) = 0;
      *(undefined4 *)((long)ida_mem + 0x6c0) = 0;
      *(undefined4 *)((long)ida_mem + 0x110) = 0;
    }
    if (*(void **)((long)ida_mem + 0x150) != (void *)0x0) {
      free(*(void **)((long)ida_mem + 0x150));
      *(undefined8 *)((long)ida_mem + 0x150) = 0;
    }
  }
  return;
}

Assistant:

void IDAQuadSensFree(void* ida_mem)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL) { return; }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_quadSensMallocDone)
  {
    IDAQuadSensFreeVectors(IDA_mem);
    IDA_mem->ida_quadSensMallocDone = SUNFALSE;
    IDA_mem->ida_quadr_sensi        = SUNFALSE;
  }

  /* free min atol array if necessary */
  if (IDA_mem->ida_atolQSmin0)
  {
    free(IDA_mem->ida_atolQSmin0);
    IDA_mem->ida_atolQSmin0 = NULL;
  }
}